

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_avcc.cpp
# Opt level: O2

int write_avcc(avcc_t *avcc,h264_stream_t *h,bs_t *b)

{
  nal_t *pnVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  uint uVar5;
  long lVar6;
  int i;
  long lVar7;
  
  bs_write_u8(b,1);
  bs_write_u8(b,avcc->AVCProfileIndication);
  bs_write_u8(b,avcc->profile_compatibility);
  bs_write_u8(b,avcc->AVCLevelIndication);
  bs_write_u(b,6,0x3f);
  bs_write_u(b,2,avcc->lengthSizeMinusOne);
  bs_write_u(b,3,7);
  bs_write_u(b,5,avcc->numOfSequenceParameterSets);
  for (lVar7 = 0; lVar7 < avcc->numOfSequenceParameterSets; lVar7 = lVar7 + 1) {
    puVar4 = (uint8_t *)malloc(0x400);
    pnVar1 = h->nal;
    pnVar1->nal_ref_idc = 3;
    pnVar1->nal_unit_type = 7;
    h->sps = avcc->sps_table[lVar7];
    uVar2 = write_nal_unit(h,puVar4,0x400);
    if (-1 < (int)uVar2) {
      bs_write_u(b,0x10,uVar2);
      lVar6 = (long)b->end - (long)b->p;
      uVar5 = (uint)lVar6;
      if ((long)(ulong)uVar2 <= lVar6) {
        uVar5 = uVar2;
      }
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      memcpy(b->p,puVar4,(ulong)uVar5);
      b->p = b->p + uVar2;
    }
    free(puVar4);
  }
  bs_write_u(b,8,avcc->numOfPictureParameterSets);
  for (lVar7 = 0; lVar7 < avcc->numOfPictureParameterSets; lVar7 = lVar7 + 1) {
    puVar4 = (uint8_t *)malloc(0x400);
    pnVar1 = h->nal;
    pnVar1->nal_ref_idc = 3;
    pnVar1->nal_unit_type = 8;
    h->pps = avcc->pps_table[lVar7];
    uVar2 = write_nal_unit(h,puVar4,0x400);
    if (-1 < (int)uVar2) {
      bs_write_u(b,0x10,uVar2);
      lVar6 = (long)b->end - (long)b->p;
      uVar5 = (uint)lVar6;
      if ((long)(ulong)uVar2 <= lVar6) {
        uVar5 = uVar2;
      }
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      memcpy(b->p,puVar4,(ulong)uVar5);
      b->p = b->p + uVar2;
    }
    free(puVar4);
  }
  if (b->end < b->p) {
    iVar3 = -1;
  }
  else {
    iVar3 = (int)b->p - *(int *)&b->start;
  }
  return iVar3;
}

Assistant:

int write_avcc(avcc_t* avcc, h264_stream_t* h, bs_t* b)
{
    bs_write_u8(b, 1); // configurationVersion = 1;
    bs_write_u8(b, avcc->AVCProfileIndication);
    bs_write_u8(b, avcc->profile_compatibility);
    bs_write_u8(b, avcc->AVCLevelIndication);
    bs_write_u(b, 6, 0x3F); // reserved = '111111'b;
    bs_write_u(b, 2, avcc->lengthSizeMinusOne);
    bs_write_u(b, 3, 0x07); // reserved = '111'b;

    bs_write_u(b, 5, avcc->numOfSequenceParameterSets);
    for (int i = 0; i < avcc->numOfSequenceParameterSets; i++)
    {
        int max_len = 1024; // FIXME
        uint8_t* buf = (uint8_t*)malloc(max_len);
        h->nal->nal_ref_idc = 3; // NAL_REF_IDC_PRIORITY_HIGHEST;
        h->nal->nal_unit_type = NAL_UNIT_TYPE_SPS;
        h->sps = avcc->sps_table[i];
        int len = write_nal_unit(h, buf, max_len);
        if (len < 0) { free(buf); continue; } // TODO report errors
        int sequenceParameterSetLength = len;
        bs_write_u(b, 16, sequenceParameterSetLength);
        bs_write_bytes(b, buf, len);
        free(buf);
    }

    bs_write_u(b, 8, avcc->numOfPictureParameterSets);
    for (int i = 0; i < avcc->numOfPictureParameterSets; i++)
    {
        int max_len = 1024; // FIXME
        uint8_t* buf = (uint8_t*)malloc(max_len);
        h->nal->nal_ref_idc = 3; // NAL_REF_IDC_PRIORITY_HIGHEST;
        h->nal->nal_unit_type = NAL_UNIT_TYPE_PPS;
        h->pps = avcc->pps_table[i];
        int len = write_nal_unit(h, buf, max_len);
        if (len < 0) { free(buf); continue; } // TODO report errors
        int pictureParameterSetLength = len;
        bs_write_u(b, 16, pictureParameterSetLength);
        bs_write_bytes(b, buf, len);
        free(buf);
    }

    if (bs_overrun(b)) { return -1; }
    return bs_pos(b);
}